

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  cmake *this_01;
  string flagVar;
  cmAlphaNum local_1e8;
  string ll;
  ostringstream w;
  
  TVar3 = GetType(this);
  if ((((TVar3 != EXECUTABLE) && (TVar3 = GetType(this), TVar3 != SHARED_LIBRARY)) &&
      (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) ||
     (bVar1 = cmTarget::GetHaveInstallRule(this->Target), !bVar1)) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"CMAKE_SKIP_RPATH",(allocator<char> *)&local_1e8);
  bVar1 = cmMakefile::IsOn(this_00,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  if (bVar1) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&local_1e8);
  bVar1 = GetPropertyAsBool(this,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  if (bVar1) {
    return false;
  }
  bVar1 = IsChrpathUsed(this,config);
  if (bVar1) {
    return false;
  }
  GetLinkerLanguage(&ll,this,config);
  if (ll._M_string_length != 0) {
    _w = (pointer)0x1d;
    local_1e8.View_._M_len = ll._M_string_length;
    local_1e8.View_._M_str = ll._M_dataplus._M_p;
    cmStrCat<char[6]>(&flagVar,(cmAlphaNum *)&w,&local_1e8,(char (*) [6])0x64368d);
    bVar1 = cmMakefile::IsSet(this->Makefile,&flagVar);
    std::__cxx11::string::~string((string *)&flagVar);
    if (bVar1) {
      bVar1 = HaveBuildTreeRPATH(this,config);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = HaveInstallTreeRPATH(this,config);
      }
      iVar4 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
      if (((byte)iVar4 & bVar2) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        poVar5 = std::operator<<((ostream *)&w,"The install of the ");
        psVar6 = GetName_abi_cxx11_(this);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::operator<<(poVar5,
                        " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based or XCOFF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                       );
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)&flagVar);
        cmake::IssueMessage(this_01,FATAL_ERROR,(string *)&local_1e8,(cmListFileBacktrace *)&flagVar
                           );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&flagVar._M_string_length);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
        bVar2 = true;
      }
      goto LAB_003d395f;
    }
  }
  bVar2 = false;
LAB_003d395f:
  std::__cxx11::string::~string((string *)&ll);
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::NeedRelinkBeforeInstall(
  const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if (this->GetType() != cmStateEnums::EXECUTABLE &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY) {
    return false;
  }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // If skipping all rpaths completely then no relinking is needed.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // If building with the install-tree rpath no relinking is needed.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // If chrpath is going to be used no relinking is needed.
  if (this->IsChrpathUsed(config)) {
    return false;
  }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string flagVar =
      cmStrCat("CMAKE_SHARED_LIBRARY_RUNTIME_", ll, "_FLAG");
    if (!this->Makefile->IsSet(flagVar)) {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
    }
  } else {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
  }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  bool have_rpath =
    this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH(config);
  bool is_ninja = this->LocalGenerator->GetGlobalGenerator()->IsNinja();

  if (have_rpath && is_ninja) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The install of the " << this->GetName() << " target requires changing "
      "an RPATH from the build tree, but this is not supported with the Ninja "
      "generator unless on an ELF-based or XCOFF-based platform.  "
      "The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this "
      "relinking step."
      ;
    /* clang-format on */

    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return have_rpath;
}